

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O0

int gzwrite(gzFile file,voidpc buf,uint len)

{
  int iVar1;
  size_t sVar2;
  uLong uVar3;
  int in_EDX;
  unsigned_long in_RSI;
  unsigned_long *in_RDI;
  gz_stream *s;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((in_RDI == (unsigned_long *)0x0) || (*(char *)((long)in_RDI + 0xac) != 'w')) {
    local_4 = -2;
  }
  else {
    *in_RDI = in_RSI;
    *(int *)(in_RDI + 1) = in_EDX;
    do {
      if ((int)in_RDI[1] == 0) break;
      if ((int)in_RDI[4] == 0) {
        in_RDI[3] = in_RDI[0x11];
        sVar2 = fwrite((void *)in_RDI[0x11],1,0x4000,(FILE *)in_RDI[0xf]);
        if (sVar2 != 0x4000) {
          *(undefined4 *)(in_RDI + 0xe) = 0xffffffff;
          break;
        }
        *(undefined4 *)(in_RDI + 4) = 0x4000;
      }
      in_RDI[0x17] = (ulong)(uint)in_RDI[1] + in_RDI[0x17];
      in_RDI[0x18] = (ulong)(uint)in_RDI[4] + in_RDI[0x18];
      iVar1 = deflate((z_streamp)file,buf._4_4_);
      *(int *)(in_RDI + 0xe) = iVar1;
      in_RDI[0x17] = in_RDI[0x17] - (ulong)(uint)in_RDI[1];
      in_RDI[0x18] = in_RDI[0x18] - (ulong)(uint)in_RDI[4];
    } while ((int)in_RDI[0xe] == 0);
    uVar3 = crc32(in_RSI,(uchar *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                  (uint)((ulong)in_RDI >> 0x20));
    in_RDI[0x12] = uVar3;
    local_4 = in_EDX - (int)in_RDI[1];
  }
  return local_4;
}

Assistant:

int ZEXPORT gzwrite (file, buf, len)
    gzFile file;
    voidpc buf;
    unsigned len;
{
    gz_stream *s = (gz_stream*)file;

    if (s == NULL || s->mode != 'w') return Z_STREAM_ERROR;

    s->stream.next_in = (Bytef*)buf;
    s->stream.avail_in = len;

    while (s->stream.avail_in != 0) {

        if (s->stream.avail_out == 0) {

            s->stream.next_out = s->outbuf;
            if (fwrite(s->outbuf, 1, Z_BUFSIZE, s->file) != Z_BUFSIZE) {
                s->z_err = Z_ERRNO;
                break;
            }
            s->stream.avail_out = Z_BUFSIZE;
        }
        s->in += s->stream.avail_in;
        s->out += s->stream.avail_out;
        s->z_err = deflate(&(s->stream), Z_NO_FLUSH);
        s->in -= s->stream.avail_in;
        s->out -= s->stream.avail_out;
        if (s->z_err != Z_OK) break;
    }
    s->crc = crc32(s->crc, (const Bytef *)buf, len);

    return (int)(len - s->stream.avail_in);
}